

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conv.cc
# Opt level: O2

Dim * __thiscall
cnn::Conv1DWide::dim_forward
          (Dim *__return_storage_ptr__,Conv1DWide *this,
          vector<cnn::Dim,_std::allocator<cnn::Dim>_> *xs)

{
  pointer pDVar1;
  ostream *poVar2;
  invalid_argument *this_00;
  initializer_list<unsigned_int> x;
  uint local_18;
  int local_14;
  
  pDVar1 = (xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)(xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)pDVar1 == 0x48) {
    if (((pDVar1->nd == 2) && (pDVar1[1].nd == 2)) && (pDVar1->d[0] == pDVar1[1].d[0])) {
      _local_18 = CONCAT44(pDVar1[1].d[1] + pDVar1->d[1] + -1,pDVar1->d[0]);
      x._M_len = 2;
      x._M_array = &local_18;
      Dim::Dim(__return_storage_ptr__,x);
      return __return_storage_ptr__;
    }
    poVar2 = std::operator<<((ostream *)&std::cerr,"Bad input dimensions in Conv1DWide: ");
    poVar2 = operator<<(poVar2,xs);
    std::endl<char,std::char_traits<char>>(poVar2);
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"bad input dimensions in Conv1DWide");
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Conv1DWide requires two inputs: ");
    poVar2 = operator<<(poVar2,xs);
    std::endl<char,std::char_traits<char>>(poVar2);
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Conv1DWide requires two inputs");
  }
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Dim Conv1DWide::dim_forward(const vector<Dim>& xs) const {
  if (xs.size() != 2) {
    cerr << "Conv1DWide requires two inputs: " << xs << endl;
    throw std::invalid_argument("Conv1DWide requires two inputs");
  }
  unsigned ocols = xs[0].cols() + xs[1].cols() - 1;
  if (xs[0].ndims() != 2 || xs[1].ndims() != 2 ||
      xs[0].rows() != xs[1].rows()) {
    cerr << "Bad input dimensions in Conv1DWide: " << xs << endl;
    throw std::invalid_argument("bad input dimensions in Conv1DWide");
  }
  return Dim({xs[0].rows(), ocols});
}